

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reset.cpp
# Opt level: O3

void RequireValueEqual(ConfigurationOption *op,Value *left,Value *right,int line)

{
  char *pcVar1;
  char cVar2;
  ostream *poVar3;
  string error;
  AssertionHandler catchAssertionHandler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  StringRef local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  AssertionHandler local_90;
  StringRef local_48;
  SourceLineInfo local_38;
  
  cVar2 = duckdb::Value::NotDistinctFrom(left,right);
  if (cVar2 == '\0') {
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,
               "\nLINE[%d] (Option:%s) | Expected left:\'%s\' and right:\'%s\' to be equal","");
    pcVar1 = op->name;
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::StringUtil::Format<int,char_const*,std::__cxx11::string,std::__cxx11::string>
              (&local_100,(StringUtil *)local_120,(string *)(ulong)(uint)line,(int)pcVar1,
               (char *)local_b0,&local_d0,in_stack_fffffffffffffed8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_120[0] != local_110) {
      operator_delete(local_120[0]);
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_100._M_dataplus._M_p,local_100._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_e0.m_start = "REQUIRE";
    local_e0.m_size = 7;
    local_38.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_reset.cpp"
    ;
    local_38.line = 0xbb;
    Catch::StringRef::StringRef(&local_48,"false");
    Catch::AssertionHandler::AssertionHandler(&local_90,&local_e0,&local_38,local_48,Normal);
    local_e0.m_start = (char *)((ulong)local_e0.m_start & 0xffffffffffffff00);
    Catch::AssertionHandler::handleExpr<bool>(&local_90,(ExprLhs<bool> *)&local_e0);
    Catch::AssertionHandler::complete(&local_90);
    if (local_90.m_completed == false) {
      (*(local_90.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void RequireValueEqual(const ConfigurationOption &op, const Value &left, const Value &right, int line) {
	if (ValueEqual(left, right)) {
		return;
	}
	auto error = StringUtil::Format("\nLINE[%d] (Option:%s) | Expected left:'%s' and right:'%s' to be equal", line,
	                                op.name, left.ToString(), right.ToString());
	cerr << error << endl;
	REQUIRE(false);
}